

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

bool S2::GetIntersectionStableSorted<double>
               (Vector3<double> *a0,Vector3<double> *a1,Vector3<double> *b0,Vector3<double> *b1,
               Vector3<double> *result)

{
  double dVar1;
  double dVar2;
  FloatType a_norm_len;
  FloatType FVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_98;
  double dStack_90;
  double local_88;
  double b0_error;
  ostream *local_70;
  double local_68;
  double b1_error;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_38 = a1->c_[2] - a0->c_[2];
  local_48 = a1->c_[0] - a0->c_[0];
  dStack_40 = a1->c_[1] - a0->c_[1];
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_48);
  local_88 = b1->c_[2] - b0->c_[2];
  local_98 = b1->c_[0] - b0->c_[0];
  dStack_90 = b1->c_[1] - b0->c_[1];
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_98);
  if (dVar1 < dVar2) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&b0_error,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
               ,0xfe,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_70,"Check failed: ((a1 - a0).Norm2()) >= ((b1 - b0).Norm2()) ");
    abort();
  }
  dVar5 = a0->c_[1] - a1->c_[1];
  dVar6 = a0->c_[2] - a1->c_[2];
  dVar7 = a0->c_[1] + a1->c_[1];
  dVar1 = a0->c_[0] - a1->c_[0];
  dVar2 = a1->c_[2] + a0->c_[2];
  dVar4 = a1->c_[0] + a0->c_[0];
  local_48 = dVar5 * dVar2 - dVar6 * dVar7;
  dStack_40 = dVar6 * dVar4 - dVar1 * dVar2;
  local_38 = dVar1 * dVar7 - dVar4 * dVar5;
  a_norm_len = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                         ((BasicVector<Vector3,_double,_3UL> *)&local_48);
  local_88 = b1->c_[2] - b0->c_[2];
  local_98 = b1->c_[0] - b0->c_[0];
  dStack_90 = b1->c_[1] - b0->c_[1];
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_98);
  dVar1 = GetProjection<double>(b0,(Vector3<double> *)&local_48,a_norm_len,a0,a1,&b0_error);
  local_68 = GetProjection<double>(b1,(Vector3<double> *)&local_48,a_norm_len,a0,a1,&b1_error);
  dVar2 = ABS(dVar1 - local_68);
  if (b0_error + b1_error < dVar2) {
    local_88 = b1->c_[2] * dVar1 - b0->c_[2] * local_68;
    local_98 = dVar1 * b1->c_[0] - local_68 * b0->c_[0];
    dStack_90 = dVar1 * b1->c_[1] - local_68 * b0->c_[1];
    dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                      ((BasicVector<Vector3,_double,_3UL> *)&local_98);
    if (2.2250738585072014e-308 <= dVar4) {
      dVar5 = local_68 * b0_error;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (dVar2 * 2.220446049250313e-16 +
          (FVar3 * ABS(dVar1 * b1_error - dVar5)) / (dVar2 - (b0_error + b1_error)) <=
          dVar4 * 7.771561172376096e-16) {
        dVar4 = 1.0 / dVar4;
        result->c_[0] = dVar4 * local_98;
        result->c_[1] = dVar4 * dStack_90;
        result->c_[2] = local_88 * dVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool GetIntersectionStableSorted(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1, Vector3<T>* result) {
  S2_DCHECK_GE((a1 - a0).Norm2(), (b1 - b0).Norm2());

  // Compute the normal of the plane through (a0, a1) in a stable way.
  Vector3<T> a_norm = (a0 - a1).CrossProd(a0 + a1);
  T a_norm_len = a_norm.Norm();
  T b_len = (b1 - b0).Norm();

  // Compute the projection (i.e., signed distance) of b0 and b1 onto the
  // plane through (a0, a1).  Distances are scaled by the length of a_norm.
  T b0_error, b1_error;
  T b0_dist = GetProjection(b0, a_norm, a_norm_len, a0, a1, &b0_error);
  T b1_dist = GetProjection(b1, a_norm, a_norm_len, a0, a1, &b1_error);

  // The total distance from b0 to b1 measured perpendicularly to (a0,a1) is
  // |b0_dist - b1_dist|.  Note that b0_dist and b1_dist generally have
  // opposite signs because b0 and b1 are on opposite sides of (a0, a1).  The
  // code below finds the intersection point by interpolating along the edge
  // (b0, b1) to a fractional distance of b0_dist / (b0_dist - b1_dist).
  //
  // It can be shown that the maximum error in the interpolation fraction is
  //
  //     (b0_dist * b1_error - b1_dist * b0_error) /
  //        (dist_sum * (dist_sum - error_sum))
  //
  // We save ourselves some work by scaling the result and the error bound by
  // "dist_sum", since the result is normalized to be unit length anyway.
  T dist_sum = fabs(b0_dist - b1_dist);
  T error_sum = b0_error + b1_error;
  if (dist_sum <= error_sum) {
    return false;  // Error is unbounded in this case.
  }
  Vector3<T> x = b0_dist * b1 - b1_dist * b0;
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  T error = b_len * fabs(b0_dist * b1_error - b1_dist * b0_error) /
      (dist_sum - error_sum) + 2 * T_ERR * dist_sum;

  // Finally we normalize the result, compute the corresponding error, and
  // check whether the total error is acceptable.
  T x_len2 = x.Norm2();
  if (x_len2 < std::numeric_limits<T>::min()) {
    // If x.Norm2() is less than the minimum normalized value of T, x_len might
    // lose precision and the result might fail to satisfy S2::IsUnitLength().
    // TODO(ericv): Implement S2::RobustNormalize().
    return false;
  }
  T x_len = sqrt(x_len2);
  const T kMaxError = kIntersectionError.radians();
  if (error > (kMaxError - T_ERR) * x_len) {
    return false;
  }
  *result = (1 / x_len) * x;
  return true;
}